

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int push_all(mg_context *ctx,FILE *fp,SOCKET sock,SSL *ssl,char *buf,int len)

{
  int iVar1;
  bool bVar2;
  int local_50;
  int nwritten;
  int n;
  double timeout;
  int len_local;
  char *buf_local;
  SSL *ssl_local;
  SOCKET sock_local;
  FILE *fp_local;
  mg_context *ctx_local;
  
  _nwritten = -1.0;
  local_50 = 0;
  if (ctx == (mg_context *)0x0) {
    ctx_local._4_4_ = -1;
  }
  else {
    if ((ctx->dd).config[0xb] != (char *)0x0) {
      iVar1 = atoi((ctx->dd).config[0xb]);
      _nwritten = (double)iVar1 / 1000.0;
    }
    timeout._4_4_ = len;
    if (_nwritten <= 0.0) {
      _nwritten = strtod("30000",(char **)0x0);
      _nwritten = _nwritten / 1000.0;
    }
    while( true ) {
      bVar2 = false;
      if (0 < timeout._4_4_) {
        bVar2 = ctx->stop_flag == 0;
      }
      if (!bVar2) goto LAB_0013138d;
      iVar1 = push_inner(ctx,fp,sock,ssl,buf + local_50,timeout._4_4_,_nwritten);
      if (iVar1 < 0) break;
      if (iVar1 == 0) goto LAB_0013138d;
      local_50 = iVar1 + local_50;
      timeout._4_4_ = timeout._4_4_ - iVar1;
    }
    if (local_50 == 0) {
      local_50 = -1;
    }
LAB_0013138d:
    ctx_local._4_4_ = local_50;
  }
  return ctx_local._4_4_;
}

Assistant:

static int
push_all(struct mg_context *ctx,
         FILE *fp,
         SOCKET sock,
         SSL *ssl,
         const char *buf,
         int len)
{
	double timeout = -1.0;
	int n, nwritten = 0;

	if (ctx == NULL) {
		return -1;
	}

	if (ctx->dd.config[REQUEST_TIMEOUT]) {
		timeout = atoi(ctx->dd.config[REQUEST_TIMEOUT]) / 1000.0;
	}
	if (timeout <= 0.0) {
		timeout = strtod(config_options[REQUEST_TIMEOUT].default_value, NULL)
		          / 1000.0;
	}

	while ((len > 0) && STOP_FLAG_IS_ZERO(&ctx->stop_flag)) {
		n = push_inner(ctx, fp, sock, ssl, buf + nwritten, len, timeout);
		if (n < 0) {
			if (nwritten == 0) {
				nwritten = -1; /* Propagate the error */
			}
			break;
		} else if (n == 0) {
			break; /* No more data to write */
		} else {
			nwritten += n;
			len -= n;
		}
	}

	return nwritten;
}